

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::SingleSampleLineRasterizer::rasterize
          (SingleSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  Vec4 *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  SingleSampleLineRasterizer *pSVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  float res_1;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  Vector<long,_2> res;
  SubpixelLineSegment line;
  int local_dc;
  int local_d4;
  Vector<long,_2> local_88;
  SubpixelLineSegment local_78;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_d4 = 1;
  if (1.0 < this->m_lineWidth) {
    fVar24 = floorf(this->m_lineWidth + 0.5);
    local_d4 = (int)fVar24;
  }
  fVar24 = (this->m_v1).m_data[1];
  fVar27 = (this->m_v1).m_data[0] - (this->m_v0).m_data[0];
  fStack_54 = -fVar24;
  fStack_50 = -(this->m_v1).m_data[2];
  fStack_4c = -(this->m_v1).m_data[3];
  fVar24 = fVar24 - (this->m_v0).m_data[1];
  local_58 = -fVar27;
  if (-fVar27 <= fVar27) {
    local_58 = fVar27;
  }
  fStack_44 = -fVar24;
  fStack_40 = -fVar24;
  fStack_3c = -fVar24;
  local_48 = -fVar24;
  if (-fVar24 <= fVar24) {
    local_48 = fVar24;
  }
  iVar16 = 0;
  lVar12 = 8;
  bVar6 = local_58 < local_48;
  pSVar10 = this;
  if (!bVar6) {
    pSVar10 = (SingleSampleLineRasterizer *)((this->m_viewport).m_data + 1);
    lVar12 = 0xc;
  }
  iVar2 = (pSVar10->m_viewport).m_data[0];
  iVar3 = *(int *)((long)(this->m_viewport).m_data + lVar12);
  local_78.m_v1.m_data[1] = (long)(local_d4 * 0x100 + -0x100 >> 1);
  local_78.m_v1.m_data[0] = (ulong)bVar6 * local_78.m_v1.m_data[1];
  local_78.m_v1.m_data[1] = (ulong)(uint)!bVar6 * local_78.m_v1.m_data[1];
  fVar24 = (this->m_v0).m_data[0];
  fVar27 = (this->m_v0).m_data[1];
  uVar22 = -(uint)(fVar24 < 0.0);
  uVar23 = -(uint)(fVar27 < 0.0);
  lVar12 = (long)(fVar24 * 256.0 + (float)(~uVar22 & 0x3f000000 | uVar22 & 0xbf000000)) -
           local_78.m_v1.m_data[0];
  lVar19 = (long)(fVar27 * 256.0 + (float)(~uVar23 & 0x3f000000 | uVar23 & 0xbf000000)) -
           local_78.m_v1.m_data[1];
  fVar24 = (this->m_v1).m_data[0];
  fVar27 = (this->m_v1).m_data[1];
  uVar22 = -(uint)(fVar24 < 0.0);
  uVar23 = -(uint)(fVar27 < 0.0);
  local_78.m_v1.m_data[0] =
       (long)(fVar24 * 256.0 + (float)(~uVar22 & 0x3f000000 | uVar22 & 0xbf000000)) -
       local_78.m_v1.m_data[0];
  local_78.m_v1.m_data[1] =
       (long)(fVar27 * 256.0 + (float)(~uVar23 & 0x3f000000 | uVar23 & 0xbf000000)) -
       local_78.m_v1.m_data[1];
  iVar11 = (this->m_curPos).m_data[1];
  if (0 < maxFragmentPackets && iVar11 <= (this->m_bboxMax).m_data[1]) {
    fVar24 = (float)local_78.m_v1.m_data[0];
    lVar15 = local_78.m_v1.m_data[0] - lVar12;
    fVar27 = (float)local_78.m_v1.m_data[1];
    lVar20 = local_78.m_v1.m_data[1] - lVar19;
    iVar18 = (this->m_curPos).m_data[0];
    iVar16 = 0;
    local_dc = iVar11;
    local_78.m_v0.m_data[0] = lVar12;
    local_78.m_v0.m_data[1] = lVar19;
    do {
      lVar17 = (long)(int)(iVar18 << 8 | 0x80);
      lVar21 = (long)(int)(iVar11 << 8 | 0x80);
      local_88.m_data[0] = lVar17;
      local_88.m_data[1] = lVar21;
      bVar7 = LineRasterUtil::doesLineSegmentExitDiamond(&local_78,&local_88);
      if (bVar7) {
        fVar25 = 0.0;
        lVar13 = lVar15;
        lVar17 = lVar17 - lVar12;
        bVar7 = true;
        do {
          bVar8 = bVar7;
          fVar25 = fVar25 + (float)lVar13 * (float)lVar17;
          lVar13 = lVar20;
          lVar17 = lVar21 - lVar19;
          bVar7 = false;
        } while (bVar8);
        if (local_58 < local_48) {
          iVar11 = iVar18;
        }
        iVar9 = iVar2 - iVar11;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        iVar11 = (iVar3 + iVar2) - iVar11;
        if (local_d4 <= iVar11) {
          iVar11 = local_d4;
        }
        iVar14 = this->m_curRowFragment + iVar9;
        if (iVar14 < iVar11) {
          fVar25 = fVar25 / ((fVar27 - (float)lVar19) * (fVar27 - (float)lVar19) +
                            (fVar24 - (float)lVar12) * (fVar24 - (float)lVar12) + 0.0);
          fVar26 = 1.0 - fVar25;
          fVar28 = 1.0 / (fVar26 + fVar25);
          fVar29 = fVar26 * fVar28;
          fVar28 = fVar28 * fVar25;
          iVar18 = iVar16 * 4;
          do {
            iVar4 = (this->m_curPos).m_data[0];
            iVar5 = (this->m_curPos).m_data[1];
            if (depthValues != (float *)0x0) {
              depthValues[iVar18] =
                   (this->m_v0).m_data[2] * fVar26 + (this->m_v1).m_data[2] * fVar25;
              depthValues[iVar18 + 1] = 0.0;
              depthValues[iVar18 + 2] = 0.0;
              depthValues[iVar18 + 3] = 0.0;
            }
            fragmentPackets[iVar16].position.m_data[0] = iVar14 * (uint)bVar6 + iVar4;
            fragmentPackets[iVar16].position.m_data[1] = iVar14 * (uint)!bVar6 + iVar5;
            fragmentPackets[iVar16].coverage = 1;
            pVVar1 = fragmentPackets[iVar16].barycentric;
            pVVar1->m_data[0] = fVar29;
            pVVar1->m_data[1] = fVar29;
            pVVar1->m_data[2] = fVar29;
            pVVar1->m_data[3] = fVar29;
            pVVar1 = fragmentPackets[iVar16].barycentric + 1;
            pVVar1->m_data[0] = fVar28;
            pVVar1->m_data[1] = fVar28;
            pVVar1->m_data[2] = fVar28;
            pVVar1->m_data[3] = fVar28;
            *(undefined1 (*) [16])fragmentPackets[iVar16].barycentric[2].m_data = ZEXT816(0);
            iVar14 = this->m_curRowFragment + 1;
            this->m_curRowFragment = iVar14;
            if ((1 - maxFragmentPackets) + iVar16 == 0) {
              *numPacketsRasterized = maxFragmentPackets;
              return;
            }
            iVar14 = iVar14 + iVar9;
            iVar18 = iVar18 + 4;
            iVar16 = iVar16 + 1;
          } while (iVar14 < iVar11);
          iVar18 = (this->m_curPos).m_data[0];
          local_dc = (this->m_curPos).m_data[1];
        }
        this->m_curRowFragment = 0;
        iVar11 = local_dc;
      }
      iVar18 = iVar18 + 1;
      (this->m_curPos).m_data[0] = iVar18;
      if ((this->m_bboxMax).m_data[0] < iVar18) {
        iVar11 = iVar11 + 1;
        (this->m_curPos).m_data[1] = iVar11;
        iVar18 = (this->m_bboxMin).m_data[0];
        (this->m_curPos).m_data[0] = iVar18;
        local_dc = iVar11;
      }
    } while ((iVar11 <= (this->m_bboxMax).m_data[1]) && (iVar16 < maxFragmentPackets));
  }
  *numPacketsRasterized = iVar16;
  return;
}

Assistant:

void SingleSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const deInt32								lineWidth			= (m_lineWidth > 1.0f) ? deFloorFloatToInt32(m_lineWidth + 0.5f) : 1;
	const bool									isXMajor			= de::abs((m_v1 - m_v0).x()) >= de::abs((m_v1 - m_v0).y());
	const tcu::IVec2							minorDirection		= (isXMajor) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	const int									minViewportLimit	= (isXMajor) ? (m_viewport.y()) : (m_viewport.x());
	const int									maxViewportLimit	= (isXMajor) ? (m_viewport.y() + m_viewport.w()) : (m_viewport.x() + m_viewport.z());
	const tcu::Vector<deInt64,2>				widthOffset			= -minorDirection.cast<deInt64>() * (toSubpixelCoord(lineWidth - 1) / 2);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy()) + widthOffset;
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy()) + widthOffset;
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											packetNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		// Should current fragment be drawn? == does the segment exit this diamond?
		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			const tcu::Vector<deInt64,2>	pr					= diamondPosition;
			const float						t					= tcu::dot((pr - pa).asFloat(), (pb - pa).asFloat()) / tcu::lengthSquared(pb.asFloat() - pa.asFloat());

			// Rasterize on only fragments that are would end up in the viewport (i.e. visible)
			const int						fragmentLocation	= (isXMajor) ? (m_curPos.y()) : (m_curPos.x());
			const int						rowFragBegin		= de::max(0, minViewportLimit - fragmentLocation);
			const int						rowFragEnd			= de::min(maxViewportLimit - fragmentLocation, lineWidth);

			// Wide lines require multiple fragments.
			for (; rowFragBegin + m_curRowFragment < rowFragEnd; m_curRowFragment++)
			{
				const int			replicationId	= rowFragBegin + m_curRowFragment;
				const tcu::IVec2	fragmentPos		= m_curPos + minorDirection * replicationId;

				// We only rasterize visible area
				DE_ASSERT(LineRasterUtil::inViewport(fragmentPos, m_viewport));

				// Compute depth values.
				if (depthValues)
				{
					const float za = m_v0.z();
					const float zb = m_v1.z();

					depthValues[packetNdx*4+0] = (1 - t) * za + t * zb;
					depthValues[packetNdx*4+1] = 0;
					depthValues[packetNdx*4+2] = 0;
					depthValues[packetNdx*4+3] = 0;
				}

				{
					// output this fragment
					// \note In order to make consistent output with multisampled line rasterization, output "barycentric" coordinates
					FragmentPacket& packet = fragmentPackets[packetNdx];

					const tcu::Vec4		b0		= tcu::Vec4(1 - t);
					const tcu::Vec4		b1		= tcu::Vec4(t);
					const tcu::Vec4		ooSum	= 1.0f / (b0 + b1);

					packet.position			= fragmentPos;
					packet.coverage			= getCoverageBit(1, 0, 0, 0);
					packet.barycentric[0]	= b0 * ooSum;
					packet.barycentric[1]	= b1 * ooSum;
					packet.barycentric[2]	= tcu::Vec4(0.0f);

					packetNdx += 1;
				}

				if (packetNdx == maxFragmentPackets)
				{
					m_curRowFragment++; // don't redraw this fragment again next time
					numPacketsRasterized = packetNdx;
					return;
				}
			}

			m_curRowFragment = 0;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}